

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O3

void __thiscall
SubprocessTestTokenAvailable::~SubprocessTestTokenAvailable(SubprocessTestTokenAvailable *this)

{
  (this->super_SubprocessTest).super_Test._vptr_Test = (_func_int **)&PTR__SubprocessTest_001fd188;
  SubprocessSet::~SubprocessSet(&(this->super_SubprocessTest).subprocs_);
  operator_delete(this,0x2d8);
  return;
}

Assistant:

TEST_F(SubprocessTest, TokenAvailable) {
  Subprocess* subproc = subprocs_.Add(kSimpleCommand);
  ASSERT_NE((Subprocess *) 0, subproc);

  // simulate GNUmake jobserver pipe with 1 token
#ifdef _WIN32
  tokens_._token_available = true;
#else
  int fds[2];
  ASSERT_EQ(0u, pipe(fds));
  tokens_._fd = fds[0];
  ASSERT_EQ(1u, write(fds[1], "T", 1));
#endif

  subprocs_.ResetTokenAvailable();
  subprocs_.DoWork(&tokens_);
#ifdef _WIN32
  tokens_._token_available = false;
  // we need to loop here as we have no conrol where the token
  // I/O completion post ends up in the queue
  while (!subproc->Done() && !subprocs_.IsTokenAvailable()) {
    subprocs_.DoWork(&tokens_);
  }
#endif

  EXPECT_TRUE(subprocs_.IsTokenAvailable());
  EXPECT_EQ(0u, subprocs_.finished_.size());

  // remove token to let DoWork() wait for command again
#ifndef _WIN32
  char token;
  ASSERT_EQ(1u, read(fds[0], &token, 1));
#endif

  while (!subproc->Done()) {
    subprocs_.DoWork(&tokens_);
  }

#ifndef _WIN32
  close(fds[1]);
  close(fds[0]);
#endif

  EXPECT_EQ(ExitSuccess, subproc->Finish());
  EXPECT_NE("", subproc->GetOutput());

  EXPECT_EQ(1u, subprocs_.finished_.size());
}